

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastV32S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ushort *ptr_00;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar5 = (ulong)ptr[1];
  if ((long)uVar5 < 0) {
    uVar3 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar3 < 0) {
      uVar6 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar6 < 0) {
        uVar3 = ((long)ptr[4] << 0x15 | 0x1fffffU) & uVar3;
        if ((long)uVar3 < 0) {
          uVar6 = ((long)ptr[5] << 0x1c | 0xfffffffU) & uVar6;
          if ((long)uVar6 < 0) {
            if (ptr[6] < '\0') {
              if (ptr[7] < '\0') {
                if (ptr[8] < '\0') {
                  if (ptr[9] < '\0') {
                    ptr_00 = (ushort *)(ptr + 0xb);
                    if ((ptr[10] != '\x01') && (ptr[10] < '\0')) {
                      pcVar2 = Error(msg,(char *)ptr_00,ctx,data,table,hasbits);
                      return pcVar2;
                    }
                  }
                  else {
                    ptr_00 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  ptr_00 = (ushort *)(ptr + 9);
                }
              }
              else {
                ptr_00 = (ushort *)(ptr + 8);
              }
            }
            else {
              ptr_00 = (ushort *)(ptr + 7);
            }
          }
          else {
            ptr_00 = (ushort *)(ptr + 6);
          }
        }
        else {
          ptr_00 = (ushort *)(ptr + 5);
        }
      }
      else {
        ptr_00 = (ushort *)(ptr + 4);
      }
      uVar3 = uVar6 & uVar3;
    }
    else {
      ptr_00 = (ushort *)(ptr + 3);
    }
    uVar5 = uVar5 & uVar3;
  }
  else {
    ptr_00 = (ushort *)(ptr + 2);
  }
  puVar4 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 3) != 0) {
LAB_00f793ab:
    AlignFail(puVar4);
  }
  *puVar4 = (uint)uVar5;
  if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar1 = (uint)table->fast_idx_mask & (uint)*ptr_00;
    if ((uVar1 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar4 & 3) != 0) goto LAB_00f793ab;
    *puVar4 = *puVar4 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
  }
  return (char *)ptr_00;
}

Assistant:

PROTOBUF_ALWAYS_INLINE const char* TcParser::FastVarintS1(
    PROTOBUF_TC_PARAM_DECL) {
  using TagType = uint8_t;
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  int64_t res;
  ptr = ShiftMixParseVarint<FieldType>(ptr + sizeof(TagType), res);
  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  hasbits |= (uint64_t{1} << data.hasbit_idx());
  RefAt<FieldType>(msg, data.offset()) = res;
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}